

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media_test.cpp
# Opt level: O2

void __thiscall
HenyeyGreenstein_SamplingOrientationBackward_Test::TestBody
          (HenyeyGreenstein_SamplingOrientationBackward_Test *this)

{
  PhaseFunctionSample *pPVar1;
  char *message;
  char *in_R9;
  int iVar2;
  int iVar3;
  Point2f u;
  Vector3f wo;
  int nBackward;
  HGPhaseFunction hg;
  Uniform2DIter __begin1;
  AssertionResult gtest_ar_;
  AssertHelper local_a8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  undefined8 local_90;
  undefined8 local_88;
  AssertionResult gtest_ar;
  optional<pbrt::PhaseFunctionSample> ps;
  Uniform2DIter __end1;
  
  nBackward = 0;
  local_98.ptr_._0_4_ = 100;
  local_90 = 0;
  hg.g = -0.95;
  local_88 = 0x853c49e6748fea9b;
  pbrt::detail::IndexingGenerator<pbrt::Uniform2D,_pbrt::detail::Uniform2DIter>::begin
            (&__begin1,(IndexingGenerator<pbrt::Uniform2D,_pbrt::detail::Uniform2DIter> *)&local_98)
  ;
  pbrt::detail::IndexingGenerator<pbrt::Uniform2D,_pbrt::detail::Uniform2DIter>::end
            (&__end1,(IndexingGenerator<pbrt::Uniform2D,_pbrt::detail::Uniform2DIter> *)&local_98);
  iVar2 = 0;
  iVar3 = 0;
  for (; __begin1.super_RNGIterator<pbrt::detail::Uniform2DIter>.
         super_IndexingIterator<pbrt::detail::Uniform2DIter>.i !=
         __end1.super_RNGIterator<pbrt::detail::Uniform2DIter>.
         super_IndexingIterator<pbrt::detail::Uniform2DIter>.i;
      __begin1.super_RNGIterator<pbrt::detail::Uniform2DIter>.
      super_IndexingIterator<pbrt::detail::Uniform2DIter>.i =
           __begin1.super_RNGIterator<pbrt::detail::Uniform2DIter>.
           super_IndexingIterator<pbrt::detail::Uniform2DIter>.i + 1) {
    u = pbrt::detail::Uniform2DIter::operator*(&__begin1);
    wo.super_Tuple3<pbrt::Vector3,_float>._0_8_ = SUB648(ZEXT464(0xbf800000),0);
    wo.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
    pbrt::HGPhaseFunction::Sample_p(&ps,&hg,wo,u);
    gtest_ar_.success_ = ps.set;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (ps.set == false) {
      testing::Message::Message((Message *)&local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"ps.has_value()",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/media_test.cpp"
                 ,0x37,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
      testing::internal::AssertHelper::operator=(&local_a8,(Message *)&local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_a0);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    pPVar1 = pstd::optional<pbrt::PhaseFunctionSample>::value(&ps);
    if ((pPVar1->wi).super_Tuple3<pbrt::Vector3,_float>.x <= 0.0) {
      iVar2 = iVar2 + 1;
      nBackward = iVar2;
    }
    else {
      iVar3 = iVar3 + 1;
    }
    pstd::optional<pbrt::PhaseFunctionSample>::~optional(&ps);
  }
  local_98.ptr_._0_4_ = iVar3 * 10;
  testing::internal::CmpHelperGE<int,int>
            ((internal *)&gtest_ar,"nBackward","10 * nForward",&nBackward,(int *)&local_98);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__begin1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/media_test.cpp"
               ,0x3e,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__begin1,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__begin1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_98);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(HenyeyGreenstein, SamplingOrientationBackward) {
    HGPhaseFunction hg(-0.95);
    Vector3f wo(-1, 0, 0);
    int nForward = 0, nBackward = 0;
    for (Point2f u : Uniform2D(100)) {
        auto ps = hg.Sample_p(wo, u);
        EXPECT_TRUE(ps.has_value());
        if (ps->wi.x > 0)
            ++nForward;
        else
            ++nBackward;
    }
    // With g = -0.95, almost all of the samples should have wi.x < 0.
    EXPECT_GE(nBackward, 10 * nForward);
}